

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::anon_unknown_1::RetrieveOptionsAssumingRightPool
               (int depth,Message *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  bool bVar1;
  byte bVar2;
  CppType CVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppFVar6;
  string *psVar7;
  Printer *in_RDX;
  int in_EDI;
  string name;
  Printer printer;
  string tmp;
  string fieldval;
  int j;
  bool repeated;
  int count;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  Printer *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  Printer *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe10;
  Reflection *in_stack_fffffffffffffe18;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_fffffffffffffe30;
  FieldDescriptor *field;
  Reflection *in_stack_fffffffffffffe40;
  Reflection *in_stack_fffffffffffffe48;
  string local_1a0 [8];
  string *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe74;
  FieldDescriptor *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe8c;
  FieldDescriptor *in_stack_fffffffffffffe90;
  Message *in_stack_fffffffffffffe98;
  Printer *in_stack_fffffffffffffea0;
  string local_140 [32];
  Printer local_120;
  string local_98 [32];
  string local_78 [36];
  int local_54;
  byte local_4d;
  int local_4c;
  int local_48;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_38;
  Reflection *local_20;
  Printer *local_18;
  int local_4;
  
  local_18 = in_RDX;
  local_4 = in_EDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x4c945b);
  local_20 = Message::GetReflection((Message *)in_stack_fffffffffffffdd0);
  field = (FieldDescriptor *)&local_38;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x4c9482);
  Reflection::ListFields(in_stack_fffffffffffffe40,(Message *)field,in_stack_fffffffffffffe30);
  local_48 = 0;
  while( true ) {
    uVar4 = (ulong)local_48;
    sVar5 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&local_38);
    if (sVar5 <= uVar4) break;
    local_4c = 1;
    local_4d = 0;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::operator[](&local_38,(long)local_48);
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4c9504);
    if (bVar1) {
      in_stack_fffffffffffffe18 = local_20;
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::operator[](&local_38,(long)local_48);
      local_4c = Reflection::FieldSize
                           (in_stack_fffffffffffffe48,(Message *)in_stack_fffffffffffffe40,field);
      local_4d = 1;
    }
    for (local_54 = 0; local_54 < local_4c; local_54 = local_54 + 1) {
      std::__cxx11::string::string(local_78);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::operator[](&local_38,(long)local_48);
      CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4c95d2);
      if (CVar3 == CPPTYPE_MESSAGE) {
        std::__cxx11::string::string(local_98);
        TextFormat::Printer::Printer(in_stack_fffffffffffffdf0);
        TextFormat::Printer::SetInitialIndentLevel(&local_120,local_4 + 1);
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::operator[](&local_38,(long)local_48);
        in_stack_fffffffffffffdfc = local_54;
        if ((local_4d & 1) == 0) {
          in_stack_fffffffffffffdfc = -1;
        }
        TextFormat::Printer::PrintFieldValueToString
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80);
        std::__cxx11::string::append((char *)local_78);
        std::__cxx11::string::append(local_78);
        std::__cxx11::string::append((ulong)local_78,(char)local_4 * '\x02');
        std::__cxx11::string::append((char *)local_78);
        TextFormat::Printer::~Printer(in_stack_fffffffffffffdd0);
        std::__cxx11::string::~string(local_98);
      }
      else {
        ppFVar6 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&local_38,(long)local_48);
        in_stack_fffffffffffffdf0 = (Printer *)*ppFVar6;
        in_stack_fffffffffffffde4 = local_54;
        if ((local_4d & 1) == 0) {
          in_stack_fffffffffffffde4 = -1;
        }
        TextFormat::PrintFieldValueToString
                  ((Message *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                   in_stack_fffffffffffffe74,in_stack_fffffffffffffe68);
      }
      std::__cxx11::string::string(local_140);
      ppFVar6 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](&local_38,(long)local_48);
      bVar1 = FieldDescriptor::is_extension(*ppFVar6);
      if (bVar1) {
        ppFVar6 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&local_38,(long)local_48);
        in_stack_fffffffffffffdd8 = FieldDescriptor::full_name_abi_cxx11_(*ppFVar6);
        std::operator+((char *)in_stack_fffffffffffffe18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(CVar3,in_stack_fffffffffffffe10));
        std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
        std::__cxx11::string::operator=(local_140,(string *)&stack0xfffffffffffffea0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
      }
      else {
        ppFVar6 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&local_38,(long)local_48);
        psVar7 = FieldDescriptor::name_abi_cxx11_(*ppFVar6);
        std::__cxx11::string::operator=(local_140,(string *)psVar7);
      }
      in_stack_fffffffffffffdd0 = local_18;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (char *)in_stack_fffffffffffffdf0);
      std::operator+(in_stack_fffffffffffffdd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdd0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffdd0,
                  (value_type *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_78);
    }
    local_48 = local_48 + 1;
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  bVar2 = bVar1 ^ 0xff;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  return (bool)(bVar2 & 1);
}

Assistant:

bool RetrieveOptionsAssumingRightPool(
    int depth, const Message& options,
    std::vector<std::string>* option_entries) {
  option_entries->clear();
  const Reflection* reflection = options.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(options, &fields);
  for (int i = 0; i < fields.size(); i++) {
    int count = 1;
    bool repeated = false;
    if (fields[i]->is_repeated()) {
      count = reflection->FieldSize(options, fields[i]);
      repeated = true;
    }
    for (int j = 0; j < count; j++) {
      std::string fieldval;
      if (fields[i]->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        std::string tmp;
        TextFormat::Printer printer;
        printer.SetInitialIndentLevel(depth + 1);
        printer.PrintFieldValueToString(options, fields[i], repeated ? j : -1,
                                        &tmp);
        fieldval.append("{\n");
        fieldval.append(tmp);
        fieldval.append(depth * 2, ' ');
        fieldval.append("}");
      } else {
        TextFormat::PrintFieldValueToString(options, fields[i],
                                            repeated ? j : -1, &fieldval);
      }
      std::string name;
      if (fields[i]->is_extension()) {
        name = "(." + fields[i]->full_name() + ")";
      } else {
        name = fields[i]->name();
      }
      option_entries->push_back(name + " = " + fieldval);
    }
  }
  return !option_entries->empty();
}